

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS
ref_grid_cell_id_nodes
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_INT cell_id,REF_INT *nnode,REF_INT *ncell,
          REF_INT **g2l,REF_INT **l2g)

{
  uint uVar1;
  REF_NODE pRVar2;
  REF_INT *pRVar3;
  undefined1 auVar4 [16];
  REF_STATUS RVar5;
  REF_INT *pRVar6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  char *pcVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  REF_INT nodes [27];
  REF_INT local_a8 [30];
  long lVar14;
  
  if (ref_cell->last_node_is_an_id == 0) {
    pcVar10 = "ref_cell with id expected";
    uVar8 = 0x1bf;
  }
  else {
    pRVar2 = ref_grid->node;
    uVar1 = pRVar2->max;
    if (-1 < (long)(int)uVar1) {
      pRVar6 = (REF_INT *)malloc((long)(int)uVar1 * 4);
      *g2l = pRVar6;
      auVar4 = _DAT_002117d0;
      if (pRVar6 == (REF_INT *)0x0) {
        pcVar10 = "malloc *g2l of REF_INT NULL";
        uVar8 = 0x1c1;
      }
      else {
        if (uVar1 != 0) {
          lVar7 = (ulong)uVar1 - 1;
          auVar12._8_4_ = (int)lVar7;
          auVar12._0_8_ = lVar7;
          auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
          lVar7 = 0;
          auVar12 = auVar12 ^ _DAT_002117d0;
          auVar13 = _DAT_002117f0;
          auVar15 = _DAT_002117c0;
          do {
            auVar16 = auVar15 ^ auVar4;
            iVar11 = auVar12._4_4_;
            if ((bool)(~(auVar16._4_4_ == iVar11 && auVar12._0_4_ < auVar16._0_4_ ||
                        iVar11 < auVar16._4_4_) & 1)) {
              *(undefined4 *)((long)pRVar6 + lVar7) = 0xffffffff;
            }
            if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
                auVar16._12_4_ <= auVar12._12_4_) {
              *(undefined4 *)((long)pRVar6 + lVar7 + 4) = 0xffffffff;
            }
            auVar16 = auVar13 ^ auVar4;
            iVar9 = auVar16._4_4_;
            if (iVar9 <= iVar11 && (iVar9 != iVar11 || auVar16._0_4_ <= auVar12._0_4_)) {
              *(undefined4 *)((long)pRVar6 + lVar7 + 8) = 0xffffffff;
              *(undefined4 *)((long)pRVar6 + lVar7 + 0xc) = 0xffffffff;
            }
            lVar14 = auVar15._8_8_;
            auVar15._0_8_ = auVar15._0_8_ + 4;
            auVar15._8_8_ = lVar14 + 4;
            lVar14 = auVar13._8_8_;
            auVar13._0_8_ = auVar13._0_8_ + 4;
            auVar13._8_8_ = lVar14 + 4;
            lVar7 = lVar7 + 0x10;
          } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar7);
        }
        iVar11 = 0;
        *nnode = 0;
        *ncell = 0;
        if (0 < ref_cell->max) {
          do {
            RVar5 = ref_cell_nodes(ref_cell,iVar11,local_a8);
            if ((RVar5 == 0) && (local_a8[ref_cell->node_per] == cell_id)) {
              *ncell = *ncell + 1;
              iVar9 = ref_cell->node_per;
              if (0 < iVar9) {
                pRVar6 = *g2l;
                lVar7 = 0;
                do {
                  if (pRVar6[local_a8[lVar7]] == -1) {
                    iVar9 = *nnode;
                    pRVar6[local_a8[lVar7]] = iVar9;
                    *nnode = iVar9 + 1;
                    iVar9 = ref_cell->node_per;
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 < iVar9);
              }
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < ref_cell->max);
        }
        if ((long)*nnode < 0) {
          pcVar10 = "malloc *l2g of REF_INT negative";
          uVar8 = 0x1d2;
          goto LAB_00152580;
        }
        pRVar6 = (REF_INT *)malloc((long)*nnode << 2);
        *l2g = pRVar6;
        if (pRVar6 != (REF_INT *)0x0) {
          *nnode = 0;
          iVar11 = pRVar2->max;
          if (0 < iVar11) {
            pRVar3 = *g2l;
            iVar9 = 0;
            lVar7 = 0;
            do {
              if (pRVar3[lVar7] != -1) {
                pRVar3[lVar7] = iVar9;
                iVar9 = *nnode;
                pRVar6[iVar9] = (REF_INT)lVar7;
                iVar9 = iVar9 + 1;
                *nnode = iVar9;
                iVar11 = pRVar2->max;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < iVar11);
          }
          return 0;
        }
        pcVar10 = "malloc *l2g of REF_INT NULL";
        uVar8 = 0x1d2;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar8,
             "ref_grid_cell_id_nodes",pcVar10);
      return 2;
    }
    pcVar10 = "malloc *g2l of REF_INT negative";
    uVar8 = 0x1c1;
  }
LAB_00152580:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar8,
         "ref_grid_cell_id_nodes",pcVar10);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_cell_id_nodes(REF_GRID ref_grid, REF_CELL ref_cell,
                                          REF_INT cell_id, REF_INT *nnode,
                                          REF_INT *ncell, REF_INT **g2l,
                                          REF_INT **l2g) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT cell, node, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  RAS(ref_cell_last_node_is_an_id(ref_cell), "ref_cell with id expected");

  ref_malloc_init(*g2l, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  (*nnode) = 0;
  (*ncell) = 0;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      (*ncell)++;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (REF_EMPTY == (*g2l)[nodes[cell_node]]) {
          (*g2l)[nodes[cell_node]] = (*nnode);
          (*nnode)++;
        }
      }
    }
  }

  ref_malloc(*l2g, *nnode, REF_INT);

  (*nnode) = 0;
  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (REF_EMPTY != (*g2l)[node]) {
      (*g2l)[node] = (*nnode);
      (*l2g)[(*nnode)] = node;
      (*nnode)++;
    }
  }

  return REF_SUCCESS;
}